

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

size_t propagatemark(global_State *g)

{
  lua_CFunction p_Var1;
  uint8_t uVar2;
  char cVar3;
  ushort uVar4;
  uint uVar5;
  uint32_t uVar6;
  GCfunc *fn_00;
  uint64_t uVar7;
  ulong uVar8;
  lua_CFunction p_Var9;
  bool bVar10;
  cTValue *pcVar11;
  char *pcVar12;
  long lVar13;
  uint uVar14;
  GCfunc *fn;
  GCobj *pGVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  
  fn_00 = (GCfunc *)(g->gc).gray.gcptr64;
  uVar2 = (fn_00->c).gct;
  (fn_00->c).marked = (fn_00->c).marked | 4;
  (g->gc).gray.gcptr64 = (fn_00->c).gclist.gcptr64;
  if (uVar2 != '\v') {
    if (uVar2 == '\b') {
      gc_traverse_func(g,fn_00);
      lVar13 = (ulong)(fn_00->c).nupvalues * 8;
      if ((fn_00->c).ffid != '\0') {
        return lVar13 + 0x30;
      }
      return lVar13 + 0x28;
    }
    if (uVar2 == '\a') {
      gc_traverse_proto(g,(GCproto *)&fn_00->c);
      return (ulong)*(uint *)(fn_00 + 1);
    }
    if (uVar2 == '\x06') {
      (fn_00->c).gclist.gcptr64 = (g->gc).grayagain.gcptr64;
      (g->gc).grayagain.gcptr64 = (uint64_t)fn_00;
      (fn_00->c).marked = (fn_00->c).marked & 0xfb;
      gc_traverse_thread(g,(lua_State *)&fn_00->c);
      return (ulong)*(uint *)((long)fn_00 + 0x58) * 8 + 0x60;
    }
    gc_traverse_trace(g,(GCtrace *)&fn_00->c);
    uVar4._0_1_ = *(uint8_t *)((long)fn_00 + 10);
    uVar4._1_1_ = *(uint8_t *)((long)fn_00 + 0xb);
    return (ulong)((uint)uVar4 * 0xc) +
           (ulong)(uint)(*(int *)((long)fn_00 + 0xc) - *(int *)&(fn_00->c).f) * 8 +
           (ulong)*(uint *)((long)&(fn_00->c).f + 4) * 4 + 0x78;
  }
  pGVar15 = *(GCobj **)((long)fn_00 + 0x20);
  uVar14 = 0;
  if (pGVar15 == (GCobj *)0x0) {
LAB_001160c6:
    uVar18 = (ulong)(fn_00->c).upvalue[0].u32.lo;
    bVar10 = true;
    if (uVar18 != 0) {
      uVar16 = 0;
      do {
        uVar8 = *(ulong *)((fn_00->c).env.gcptr64 + uVar16 * 8);
        if (((int)((long)uVar8 >> 0x2f) + 0xdU < 9) &&
           (pGVar15 = (GCobj *)(uVar8 & 0x7fffffffffff), ((pGVar15->gch).marked & 3) != 0)) {
          gc_mark(g,pGVar15);
        }
        uVar16 = uVar16 + 1;
      } while (uVar18 != uVar16);
    }
LAB_00116113:
    uVar5 = (fn_00->c).upvalue[0].field_4.it;
    if (uVar5 != 0) {
      p_Var9 = (fn_00->c).f;
      uVar18 = 0;
      do {
        if (*(long *)(p_Var9 + uVar18 * 0x18) != -1) {
          p_Var1 = p_Var9 + uVar18 * 0x18;
          if ((((uVar14 & 8) == 0) &&
              (uVar16 = *(ulong *)(p_Var1 + 8), (int)((long)uVar16 >> 0x2f) + 0xdU < 9)) &&
             (pGVar15 = (GCobj *)(uVar16 & 0x7fffffffffff), ((pGVar15->gch).marked & 3) != 0)) {
            gc_mark(g,pGVar15);
          }
          if (((bVar10) && (uVar16 = *(ulong *)p_Var1, (int)((long)uVar16 >> 0x2f) + 0xdU < 9)) &&
             (pGVar15 = (GCobj *)(uVar16 & 0x7fffffffffff), ((pGVar15->gch).marked & 3) != 0)) {
            gc_mark(g,pGVar15);
          }
        }
        uVar17 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar17;
      } while (uVar17 <= uVar5);
    }
    if ((int)uVar14 < 1) goto LAB_001161c3;
  }
  else {
    if (((pGVar15->gch).marked & 3) != 0) {
      gc_mark(g,pGVar15);
    }
    uVar14 = 0;
    if (((pGVar15->gch).unused1 & 8) != 0) goto LAB_001160c6;
    pcVar11 = lj_meta_cache(&pGVar15->tab,MM_mode,(GCstr *)g->gcroot[3].gcptr64);
    if (pcVar11 == (cTValue *)0x0) {
LAB_001160c4:
      uVar14 = 0;
      goto LAB_001160c6;
    }
    uVar14 = 0;
    if ((pcVar11->field_4).it >> 0xf != 0x1fffb) goto LAB_001160c6;
    pcVar12 = (char *)(((ulong)pcVar11->field_4 & 0x7fffffffffff) + 0x18);
    uVar14 = 0;
    while (cVar3 = *pcVar12, cVar3 != '\0') {
      pcVar12 = pcVar12 + 1;
      if (cVar3 == 'v') {
        uVar14 = uVar14 | 0x10;
      }
      else if (cVar3 == 'k') {
        uVar14 = uVar14 | 8;
      }
    }
    if (uVar14 == 0) goto LAB_001160c4;
    uVar7 = (g->ctype_state).ptr64;
    if ((uVar7 != 0) && (*(GCfunc **)(uVar7 + 0x20) == fn_00)) {
      uVar14 = 0xffffffef;
      goto LAB_001160c6;
    }
    (fn_00->c).marked = (byte)uVar14 | (fn_00->c).marked & 0xe7;
    (fn_00->c).gclist.gcptr64 = (g->gc).weak.gcptr64;
    (g->gc).weak.gcptr64 = (uint64_t)fn_00;
    if (uVar14 != 0x18) {
      if ((uVar14 & 0x10) == 0) goto LAB_001160c6;
      bVar10 = false;
      goto LAB_00116113;
    }
  }
  (fn_00->c).marked = (fn_00->c).marked & 0xfb;
LAB_001161c3:
  uVar6 = (fn_00->c).upvalue[0].field_4.it;
  lVar13 = 0;
  if (uVar6 != 0) {
    lVar13 = (ulong)(uVar6 + 1) * 0x18;
  }
  return lVar13 + (ulong)(fn_00->c).upvalue[0].u32.lo * 8 + 0x40;
}

Assistant:

static size_t propagatemark(global_State *g)
{
  GCobj *o = gcref(g->gc.gray);
  int gct = o->gch.gct;
  lj_assertG(isgray(o), "propagation of non-gray object");
  gray2black(o);
  setgcrefr(g->gc.gray, o->gch.gclist);  /* Remove from gray list. */
  if (LJ_LIKELY(gct == ~LJ_TTAB)) {
    GCtab *t = gco2tab(o);
    if (gc_traverse_tab(g, t) > 0)
      black2gray(o);  /* Keep weak tables gray. */
    return sizeof(GCtab) + sizeof(TValue) * t->asize +
			   (t->hmask ? sizeof(Node) * (t->hmask + 1) : 0);
  } else if (LJ_LIKELY(gct == ~LJ_TFUNC)) {
    GCfunc *fn = gco2func(o);
    gc_traverse_func(g, fn);
    return isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			   sizeCfunc((MSize)fn->c.nupvalues);
  } else if (LJ_LIKELY(gct == ~LJ_TPROTO)) {
    GCproto *pt = gco2pt(o);
    gc_traverse_proto(g, pt);
    return pt->sizept;
  } else if (LJ_LIKELY(gct == ~LJ_TTHREAD)) {
    lua_State *th = gco2th(o);
    setgcrefr(th->gclist, g->gc.grayagain);
    setgcref(g->gc.grayagain, o);
    black2gray(o);  /* Threads are never black. */
    gc_traverse_thread(g, th);
    return sizeof(lua_State) + sizeof(TValue) * th->stacksize;
  } else {
#if LJ_HASJIT
    GCtrace *T = gco2trace(o);
    gc_traverse_trace(g, T);
    return ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
	   T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry);
#else
    lj_assertG(0, "bad GC type %d", gct);
    return 0;
#endif
  }
}